

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<reflection::KeyValue>
          (FlatBufferBuilderImpl<false> *this,Offset<reflection::KeyValue> *v,size_t len)

{
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> OVar1;
  TableKeyComparator<reflection::KeyValue> local_30;
  size_t local_28;
  size_t len_local;
  Offset<reflection::KeyValue> *v_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  local_28 = len;
  len_local = (size_t)v;
  v_local = (Offset<reflection::KeyValue> *)this;
  TableKeyComparator<reflection::KeyValue>::TableKeyComparator(&local_30,&this->buf_);
  std::
  stable_sort<flatbuffers::Offset<reflection::KeyValue>*,flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<reflection::KeyValue>>
            (v,v + len,&local_30);
  OVar1 = CreateVector<reflection::KeyValue>
                    (this,(Offset<reflection::KeyValue> *)len_local,local_28);
  return (Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>)
         OVar1.o;
}

Assistant:

Offset<Vector<Offset<T>>> CreateVectorOfSortedTables(Offset<T> *v,
                                                       size_t len) {
    std::stable_sort(v, v + len, TableKeyComparator<T>(buf_));
    return CreateVector(v, len);
  }